

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_8_0_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  long lVar52;
  long lVar53;
  uint uVar54;
  long lVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar61 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined2 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined8 uVar128;
  undefined8 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 local_98 [32];
  
  bVar56 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar52 = (long)dir;
  lVar42 = (long)cdef_directions_padded[lVar52 + 2][0];
  lVar47 = (long)cdef_directions_padded[lVar52 + 2][1];
  lVar48 = (long)cdef_directions_padded[lVar52 + 4][0];
  lVar49 = (long)cdef_directions_padded[lVar52 + 4][1];
  lVar43 = (long)cdef_directions_padded[lVar52][0];
  lVar52 = (long)cdef_directions_padded[lVar52][1];
  local_98._2_2_ = (undefined2)pri_strength;
  uVar75 = (undefined2)sec_strength;
  if (block_width == 8) {
    uVar51 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar51 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar51 = 0;
      }
    }
    uVar54 = sec_damping;
    if (sec_strength != 0) {
      iVar3 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar54 = sec_damping - iVar3;
      if (sec_damping < iVar3) {
        uVar54 = 0;
      }
    }
    if (0 < block_height) {
      local_98._0_2_ = local_98._2_2_;
      local_98._4_2_ = local_98._2_2_;
      local_98._6_2_ = local_98._2_2_;
      local_98._8_2_ = local_98._2_2_;
      local_98._10_2_ = local_98._2_2_;
      local_98._12_2_ = local_98._2_2_;
      local_98._14_2_ = local_98._2_2_;
      local_98._16_2_ = local_98._2_2_;
      local_98._18_2_ = local_98._2_2_;
      local_98._20_2_ = local_98._2_2_;
      local_98._22_2_ = local_98._2_2_;
      local_98._24_2_ = local_98._2_2_;
      local_98._26_2_ = local_98._2_2_;
      local_98._28_2_ = local_98._2_2_;
      local_98._30_2_ = local_98._2_2_;
      auVar57 = ZEXT416(uVar51);
      uVar1 = (undefined2)cdef_pri_taps[bVar56][0];
      uVar2 = (undefined2)cdef_pri_taps[bVar56][1];
      auVar58 = ZEXT416(uVar54);
      uVar45 = 0;
      do {
        auVar126 = ZEXT116(0) * *(undefined1 (*) [16])in +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
        auVar59 = ZEXT116(1) * *(undefined1 (*) [16])in;
        uVar128 = auVar59._0_8_;
        uVar129 = auVar59._8_8_;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar42 * 2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar42 * 2));
        auVar85._16_16_ = auVar59;
        auVar85._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar42 * -2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar42 * -2 + 0x120));
        auVar100._16_16_ = auVar59;
        auVar100._0_16_ = auVar60;
        auVar5._16_8_ = uVar128;
        auVar5._0_16_ = auVar126;
        auVar5._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar85,auVar5);
        auVar102 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar65 = vpsrlw_avx2(auVar62,auVar57);
        auVar65 = vpsubusw_avx2(local_98,auVar65);
        auVar62 = vpminsw_avx2(auVar65,auVar62);
        auVar65 = vpaddw_avx2(auVar62,auVar102);
        auVar6._16_8_ = uVar128;
        auVar6._0_16_ = auVar126;
        auVar6._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar100,auVar6);
        auVar114 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar4 = vpsrlw_avx2(auVar62,auVar57);
        auVar4 = vpsubusw_avx2(local_98,auVar4);
        auVar62 = vpminsw_avx2(auVar4,auVar62);
        auVar62 = vpaddw_avx2(auVar114,auVar62);
        auVar62 = vpaddw_avx2(auVar114 ^ auVar62,auVar65 ^ auVar102);
        auVar37._2_2_ = uVar1;
        auVar37._0_2_ = uVar1;
        auVar37._4_2_ = uVar1;
        auVar37._6_2_ = uVar1;
        auVar37._8_2_ = uVar1;
        auVar37._10_2_ = uVar1;
        auVar37._12_2_ = uVar1;
        auVar37._14_2_ = uVar1;
        auVar37._16_2_ = uVar1;
        auVar37._18_2_ = uVar1;
        auVar37._20_2_ = uVar1;
        auVar37._22_2_ = uVar1;
        auVar37._24_2_ = uVar1;
        auVar37._26_2_ = uVar1;
        auVar37._28_2_ = uVar1;
        auVar37._30_2_ = uVar1;
        auVar4 = vpmullw_avx2(auVar62,auVar37);
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar47 * 2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar47 * 2));
        auVar103._16_16_ = auVar59;
        auVar103._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar47 * -2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar47 * -2 + 0x120));
        auVar115._16_16_ = auVar59;
        auVar115._0_16_ = auVar60;
        auVar7._16_8_ = uVar128;
        auVar7._0_16_ = auVar126;
        auVar7._24_8_ = uVar129;
        auVar102 = vpsubw_avx2(auVar103,auVar7);
        auVar62 = vpabsw_avx2(auVar102);
        auVar65 = vpsrlw_avx2(auVar62,auVar57);
        auVar114 = vpsraw_avx2(auVar102,0xf);
        auVar65 = vpsubusw_avx2(local_98,auVar65);
        auVar62 = vpminsw_avx2(auVar62,auVar65);
        auVar65 = vpaddw_avx2(auVar62,auVar114);
        auVar8._16_8_ = uVar128;
        auVar8._0_16_ = auVar126;
        auVar8._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar115,auVar8);
        auVar136 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar102 = vpsrlw_avx2(auVar62,auVar57);
        auVar102 = vpsubusw_avx2(local_98,auVar102);
        auVar62 = vpminsw_avx2(auVar62,auVar102);
        auVar62 = vpaddw_avx2(auVar62,auVar136);
        auVar62 = vpaddw_avx2(auVar62 ^ auVar136,auVar65 ^ auVar114);
        auVar35._2_2_ = uVar2;
        auVar35._0_2_ = uVar2;
        auVar35._4_2_ = uVar2;
        auVar35._6_2_ = uVar2;
        auVar35._8_2_ = uVar2;
        auVar35._10_2_ = uVar2;
        auVar35._12_2_ = uVar2;
        auVar35._14_2_ = uVar2;
        auVar35._16_2_ = uVar2;
        auVar35._18_2_ = uVar2;
        auVar35._20_2_ = uVar2;
        auVar35._22_2_ = uVar2;
        auVar35._24_2_ = uVar2;
        auVar35._26_2_ = uVar2;
        auVar35._28_2_ = uVar2;
        auVar35._30_2_ = uVar2;
        auVar62 = vpmullw_avx2(auVar62,auVar35);
        auVar65 = vpaddw_avx2(auVar62,auVar4);
        auVar62 = vpmaxub_avx2(auVar85,auVar100);
        auVar4 = vpmaxub_avx2(auVar115,auVar103);
        auVar114 = vpmaxub_avx2(auVar62,auVar4);
        auVar62 = vpminsw_avx2(auVar85,auVar100);
        auVar62 = vpminsw_avx2(auVar62,auVar103);
        auVar136 = vpminsw_avx2(auVar115,auVar62);
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar48 * 2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar48 * 2));
        auVar141._16_16_ = auVar59;
        auVar141._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar48 * -2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar48 * -2 + 0x120));
        auVar142._16_16_ = auVar59;
        auVar142._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar43 * 2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar43 * 2));
        auVar144._16_16_ = auVar59;
        auVar144._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar43 * -2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar43 * -2 + 0x120));
        auVar86._16_16_ = auVar59;
        auVar86._0_16_ = auVar60;
        auVar9._16_8_ = uVar128;
        auVar9._0_16_ = auVar126;
        auVar9._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar141,auVar9);
        auVar104 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar4 = vpsrlw_avx2(auVar62,auVar58);
        auVar33._2_2_ = uVar75;
        auVar33._0_2_ = uVar75;
        auVar33._4_2_ = uVar75;
        auVar33._6_2_ = uVar75;
        auVar33._8_2_ = uVar75;
        auVar33._10_2_ = uVar75;
        auVar33._12_2_ = uVar75;
        auVar33._14_2_ = uVar75;
        auVar33._16_2_ = uVar75;
        auVar33._18_2_ = uVar75;
        auVar33._20_2_ = uVar75;
        auVar33._22_2_ = uVar75;
        auVar33._24_2_ = uVar75;
        auVar33._26_2_ = uVar75;
        auVar33._28_2_ = uVar75;
        auVar33._30_2_ = uVar75;
        auVar4 = vpsubusw_avx2(auVar33,auVar4);
        auVar62 = vpminsw_avx2(auVar4,auVar62);
        auVar4 = vpaddw_avx2(auVar62,auVar104);
        auVar10._16_8_ = uVar128;
        auVar10._0_16_ = auVar126;
        auVar10._24_8_ = uVar129;
        auVar105 = vpsubw_avx2(auVar142,auVar10);
        auVar62 = vpabsw_avx2(auVar105);
        auVar102 = vpsrlw_avx2(auVar62,auVar58);
        auVar105 = vpsraw_avx2(auVar105,0xf);
        auVar102 = vpsubusw_avx2(auVar33,auVar102);
        auVar62 = vpminsw_avx2(auVar62,auVar102);
        auVar62 = vpaddw_avx2(auVar62,auVar105);
        auVar4 = vpaddw_avx2(auVar62 ^ auVar105,auVar4 ^ auVar104);
        auVar11._16_8_ = uVar128;
        auVar11._0_16_ = auVar126;
        auVar11._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar144,auVar11);
        auVar104 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar102 = vpsrlw_avx2(auVar62,auVar58);
        auVar102 = vpsubusw_avx2(auVar33,auVar102);
        auVar62 = vpminsw_avx2(auVar102,auVar62);
        auVar102 = vpaddw_avx2(auVar104,auVar62);
        auVar12._16_8_ = uVar128;
        auVar12._0_16_ = auVar126;
        auVar12._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar86,auVar12);
        auVar122 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar105 = vpsrlw_avx2(auVar62,auVar58);
        auVar105 = vpsubusw_avx2(auVar33,auVar105);
        auVar62 = vpminsw_avx2(auVar62,auVar105);
        auVar62 = vpaddw_avx2(auVar122,auVar62);
        auVar62 = vpaddw_avx2(auVar104 ^ auVar102,auVar122 ^ auVar62);
        auVar62 = vpaddw_avx2(auVar4,auVar62);
        auVar31._8_2_ = 2;
        auVar31._0_8_ = 0x2000200020002;
        auVar31._10_2_ = 2;
        auVar31._12_2_ = 2;
        auVar31._14_2_ = 2;
        auVar31._16_2_ = 2;
        auVar31._18_2_ = 2;
        auVar31._20_2_ = 2;
        auVar31._22_2_ = 2;
        auVar31._24_2_ = 2;
        auVar31._26_2_ = 2;
        auVar31._28_2_ = 2;
        auVar31._30_2_ = 2;
        auVar62 = vpmullw_avx2(auVar62,auVar31);
        auVar65 = vpaddw_avx2(auVar65,auVar62);
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar49 * 2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar49 * 2));
        auVar89._16_16_ = auVar59;
        auVar89._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar49 * -2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar49 * -2 + 0x120));
        auVar101._16_16_ = auVar59;
        auVar101._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar52 * 2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar52 * 2));
        auVar106._16_16_ = auVar59;
        auVar106._0_16_ = auVar60;
        auVar59 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar52 * -2));
        auVar60 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar52 * -2 + 0x120));
        auVar123._16_16_ = auVar59;
        auVar123._0_16_ = auVar60;
        auVar13._16_8_ = uVar128;
        auVar13._0_16_ = auVar126;
        auVar13._24_8_ = uVar129;
        auVar102 = vpsubw_avx2(auVar89,auVar13);
        auVar62 = vpabsw_avx2(auVar102);
        auVar4 = vpsrlw_avx2(auVar62,auVar58);
        auVar105 = vpsraw_avx2(auVar102,0xf);
        auVar4 = vpsubusw_avx2(auVar33,auVar4);
        auVar62 = vpminsw_avx2(auVar62,auVar4);
        auVar4 = vpaddw_avx2(auVar62,auVar105);
        auVar14._16_8_ = uVar128;
        auVar14._0_16_ = auVar126;
        auVar14._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar101,auVar14);
        auVar104 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar102 = vpsrlw_avx2(auVar62,auVar58);
        auVar102 = vpsubusw_avx2(auVar33,auVar102);
        auVar62 = vpminsw_avx2(auVar102,auVar62);
        auVar62 = vpaddw_avx2(auVar62,auVar104);
        auVar4 = vpaddw_avx2(auVar62 ^ auVar104,auVar4 ^ auVar105);
        auVar15._16_8_ = uVar128;
        auVar15._0_16_ = auVar126;
        auVar15._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar106,auVar15);
        auVar122 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar102 = vpsrlw_avx2(auVar62,auVar58);
        auVar102 = vpsubusw_avx2(auVar33,auVar102);
        auVar62 = vpminsw_avx2(auVar102,auVar62);
        auVar102 = vpaddw_avx2(auVar62,auVar122);
        auVar16._16_8_ = uVar128;
        auVar16._0_16_ = auVar126;
        auVar16._24_8_ = uVar129;
        auVar104 = vpsubw_avx2(auVar123,auVar16);
        auVar62 = vpabsw_avx2(auVar104);
        auVar105 = vpsrlw_avx2(auVar62,auVar58);
        auVar105 = vpsubusw_avx2(auVar33,auVar105);
        auVar62 = vpminsw_avx2(auVar62,auVar105);
        auVar105 = vpsraw_avx2(auVar104,0xf);
        auVar62 = vpaddw_avx2(auVar62,auVar105);
        auVar62 = vpaddw_avx2(auVar102 ^ auVar122,auVar62 ^ auVar105);
        auVar62 = vpaddw_avx2(auVar4,auVar62);
        auVar29._8_2_ = 1;
        auVar29._0_8_ = 0x1000100010001;
        auVar29._10_2_ = 1;
        auVar29._12_2_ = 1;
        auVar29._14_2_ = 1;
        auVar29._16_2_ = 1;
        auVar29._18_2_ = 1;
        auVar29._20_2_ = 1;
        auVar29._22_2_ = 1;
        auVar29._24_2_ = 1;
        auVar29._26_2_ = 1;
        auVar29._28_2_ = 1;
        auVar29._30_2_ = 1;
        auVar62 = vpmullw_avx2(auVar62,auVar29);
        auVar62 = vpaddw_avx2(auVar65,auVar62);
        auVar65 = vpmaxub_avx2(auVar141,auVar142);
        auVar4 = vpmaxub_avx2(auVar144,auVar86);
        auVar65 = vpmaxub_avx2(auVar65,auVar4);
        auVar4 = vpmaxub_avx2(auVar89,auVar101);
        auVar4 = vpmaxub_avx2(auVar4,auVar106);
        auVar4 = vpmaxub_avx2(auVar65,auVar4);
        auVar28._8_2_ = 0xbfff;
        auVar28._0_8_ = 0xbfffbfffbfffbfff;
        auVar28._10_2_ = 0xbfff;
        auVar28._12_2_ = 0xbfff;
        auVar28._14_2_ = 0xbfff;
        auVar28._16_2_ = 0xbfff;
        auVar28._18_2_ = 0xbfff;
        auVar28._20_2_ = 0xbfff;
        auVar28._22_2_ = 0xbfff;
        auVar28._24_2_ = 0xbfff;
        auVar28._26_2_ = 0xbfff;
        auVar28._28_2_ = 0xbfff;
        auVar28._30_2_ = 0xbfff;
        auVar65 = vpand_avx2(auVar28,auVar114);
        auVar4 = vpmaxub_avx2(auVar123,auVar4);
        auVar4 = vpand_avx2(auVar4,auVar28);
        auVar65 = vpmaxsw_avx2(auVar65,auVar4);
        auVar4 = vpminsw_avx2(auVar141,auVar136);
        auVar4 = vpminsw_avx2(auVar142,auVar4);
        auVar4 = vpminsw_avx2(auVar144,auVar4);
        auVar4 = vpminsw_avx2(auVar4,auVar86);
        auVar102 = vpminsw_avx2(auVar89,auVar101);
        auVar102 = vpminsw_avx2(auVar102,auVar106);
        auVar102 = vpminsw_avx2(auVar123,auVar102);
        auVar17._16_8_ = uVar128;
        auVar17._0_16_ = auVar126;
        auVar17._24_8_ = uVar129;
        auVar4 = vpminsw_avx2(auVar17,auVar4);
        auVar4 = vpminsw_avx2(auVar4,auVar102);
        auVar102 = vpsraw_avx2(auVar62,0xf);
        auVar26._8_2_ = 8;
        auVar26._0_8_ = 0x8000800080008;
        auVar26._10_2_ = 8;
        auVar26._12_2_ = 8;
        auVar26._14_2_ = 8;
        auVar26._16_2_ = 8;
        auVar26._18_2_ = 8;
        auVar26._20_2_ = 8;
        auVar26._22_2_ = 8;
        auVar26._24_2_ = 8;
        auVar26._26_2_ = 8;
        auVar26._28_2_ = 8;
        auVar26._30_2_ = 8;
        auVar62 = vpaddw_avx2(auVar62,auVar26);
        auVar62 = vpaddw_avx2(auVar62,auVar102);
        auVar18._16_8_ = uVar128;
        auVar18._0_16_ = auVar126;
        auVar18._24_8_ = uVar129;
        auVar65 = vpmaxsw_avx2(auVar18,auVar65);
        auVar62 = vpsraw_avx2(auVar62,4);
        auVar19._16_8_ = uVar128;
        auVar19._0_16_ = auVar126;
        auVar19._24_8_ = uVar129;
        auVar62 = vpaddw_avx2(auVar19,auVar62);
        auVar62 = vpmaxsw_avx2(auVar62,auVar4);
        auVar62 = vpminsw_avx2(auVar62,auVar65);
        auVar62 = vpackuswb_avx2(auVar62,auVar62);
        *(long *)dest = auVar62._16_8_;
        *(long *)((long)dest + (long)dstride) = auVar62._0_8_;
        uVar45 = uVar45 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)dest + (long)dstride * 2);
      } while (uVar45 < (uint)block_height);
    }
  }
  else {
    uVar51 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar51 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar51 = 0;
      }
    }
    uVar54 = sec_damping;
    if (sec_strength != 0) {
      iVar3 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar54 = sec_damping - iVar3;
      if (sec_damping < iVar3) {
        uVar54 = 0;
      }
    }
    if (0 < block_height) {
      uVar1 = (undefined2)cdef_pri_taps[bVar56][0];
      uVar2 = (undefined2)cdef_pri_taps[bVar56][1];
      auVar57 = ZEXT416(uVar51);
      auVar62._2_2_ = uVar75;
      auVar62._0_2_ = uVar75;
      auVar62._4_2_ = uVar75;
      auVar62._6_2_ = uVar75;
      auVar62._8_2_ = uVar75;
      auVar62._10_2_ = uVar75;
      auVar62._12_2_ = uVar75;
      auVar62._14_2_ = uVar75;
      auVar62._16_2_ = uVar75;
      auVar62._18_2_ = uVar75;
      auVar62._20_2_ = uVar75;
      auVar62._22_2_ = uVar75;
      auVar62._24_2_ = uVar75;
      auVar62._26_2_ = uVar75;
      auVar62._28_2_ = uVar75;
      auVar62._30_2_ = uVar75;
      lVar46 = (long)dstride;
      lVar40 = lVar52 * -2;
      lVar55 = lVar49 * -2;
      lVar50 = lVar43 * -2;
      lVar53 = lVar48 * -2;
      lVar44 = lVar47 * -2;
      lVar41 = lVar42 * -2;
      uVar45 = 0;
      do {
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)in;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)((long)in + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar127,auVar58);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = *(ulong *)((long)in + 0x240);
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)((long)in + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar76,auVar66);
        auVar127 = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar58 = ZEXT116(1) * auVar58;
        uVar128 = auVar58._0_8_;
        uVar129 = auVar58._8_8_;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)in + lVar42 * 2);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)((long)in + lVar42 * 2 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar67,auVar59);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)((long)in + lVar42 * 2 + 0x240);
        auVar77._8_8_ = 0;
        auVar77._0_8_ = *(ulong *)((long)in + lVar42 * 2 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar77,auVar68);
        auVar73._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar73._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
        auVar65._16_8_ = uVar128;
        auVar65._0_16_ = auVar127;
        auVar65._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar73,auVar65);
        auVar114 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar4 = vpsrlw_avx2(auVar65,auVar57);
        auVar38._2_2_ = local_98._2_2_;
        auVar38._0_2_ = local_98._2_2_;
        auVar38._4_2_ = local_98._2_2_;
        auVar38._6_2_ = local_98._2_2_;
        auVar38._8_2_ = local_98._2_2_;
        auVar38._10_2_ = local_98._2_2_;
        auVar38._12_2_ = local_98._2_2_;
        auVar38._14_2_ = local_98._2_2_;
        auVar38._16_2_ = local_98._2_2_;
        auVar38._18_2_ = local_98._2_2_;
        auVar38._20_2_ = local_98._2_2_;
        auVar38._22_2_ = local_98._2_2_;
        auVar38._24_2_ = local_98._2_2_;
        auVar38._26_2_ = local_98._2_2_;
        auVar38._28_2_ = local_98._2_2_;
        auVar38._30_2_ = local_98._2_2_;
        auVar4 = vpsubusw_avx2(auVar38,auVar4);
        auVar65 = vpminsw_avx2(auVar65,auVar4);
        auVar4 = vpaddw_avx2(auVar65,auVar114);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)((long)in + lVar41);
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)((long)in + lVar41 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar90,auVar78);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = *(ulong *)((long)in + lVar41 + 0x240);
        auVar95._8_8_ = 0;
        auVar95._0_8_ = *(ulong *)((long)in + lVar41 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar95,auVar91);
        auVar87._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar87._16_16_ = ZEXT116(1) * auVar58;
        auVar102._16_8_ = uVar128;
        auVar102._0_16_ = auVar127;
        auVar102._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar87,auVar102);
        auVar136 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar102 = vpsrlw_avx2(auVar65,auVar57);
        auVar102 = vpsubusw_avx2(auVar38,auVar102);
        auVar65 = vpminsw_avx2(auVar102,auVar65);
        auVar65 = vpaddw_avx2(auVar65,auVar136);
        auVar65 = vpaddw_avx2(auVar65 ^ auVar136,auVar4 ^ auVar114);
        auVar36._2_2_ = uVar1;
        auVar36._0_2_ = uVar1;
        auVar36._4_2_ = uVar1;
        auVar36._6_2_ = uVar1;
        auVar36._8_2_ = uVar1;
        auVar36._10_2_ = uVar1;
        auVar36._12_2_ = uVar1;
        auVar36._14_2_ = uVar1;
        auVar36._16_2_ = uVar1;
        auVar36._18_2_ = uVar1;
        auVar36._20_2_ = uVar1;
        auVar36._22_2_ = uVar1;
        auVar36._24_2_ = uVar1;
        auVar36._26_2_ = uVar1;
        auVar36._28_2_ = uVar1;
        auVar36._30_2_ = uVar1;
        auVar102 = vpmullw_avx2(auVar65,auVar36);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)((long)in + lVar47 * 2);
        auVar96._8_8_ = 0;
        auVar96._0_8_ = *(ulong *)((long)in + lVar47 * 2 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar96,auVar60);
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)((long)in + lVar47 * 2 + 0x240);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)((long)in + lVar47 * 2 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar107,auVar97);
        auVar63._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar63._16_16_ = ZEXT116(1) * auVar58;
        auVar4._16_8_ = uVar128;
        auVar4._0_16_ = auVar127;
        auVar4._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar63,auVar4);
        auVar136 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar4 = vpsrlw_avx2(auVar65,auVar57);
        auVar4 = vpsubusw_avx2(auVar38,auVar4);
        auVar65 = vpminsw_avx2(auVar4,auVar65);
        auVar4 = vpaddw_avx2(auVar136,auVar65);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = *(ulong *)((long)in + lVar44);
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)((long)in + lVar44 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar117,auVar108);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = *(ulong *)((long)in + lVar44 + 0x240);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = *(ulong *)((long)in + lVar44 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar130,auVar118);
        auVar124._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar124._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
        auVar114._16_8_ = uVar128;
        auVar114._0_16_ = auVar127;
        auVar114._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar124,auVar114);
        auVar105 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar114 = vpsrlw_avx2(auVar65,auVar57);
        auVar114 = vpsubusw_avx2(auVar38,auVar114);
        auVar65 = vpminsw_avx2(auVar65,auVar114);
        auVar65 = vpaddw_avx2(auVar65,auVar105);
        auVar65 = vpaddw_avx2(auVar65 ^ auVar105,auVar136 ^ auVar4);
        auVar34._2_2_ = uVar2;
        auVar34._0_2_ = uVar2;
        auVar34._4_2_ = uVar2;
        auVar34._6_2_ = uVar2;
        auVar34._8_2_ = uVar2;
        auVar34._10_2_ = uVar2;
        auVar34._12_2_ = uVar2;
        auVar34._14_2_ = uVar2;
        auVar34._16_2_ = uVar2;
        auVar34._18_2_ = uVar2;
        auVar34._20_2_ = uVar2;
        auVar34._22_2_ = uVar2;
        auVar34._24_2_ = uVar2;
        auVar34._26_2_ = uVar2;
        auVar34._28_2_ = uVar2;
        auVar34._30_2_ = uVar2;
        auVar65 = vpmullw_avx2(auVar65,auVar34);
        auVar4 = vpaddw_avx2(auVar65,auVar102);
        auVar65 = vpmaxub_avx2(auVar73,auVar87);
        auVar102 = vpmaxub_avx2(auVar124,auVar63);
        auVar136 = vpmaxub_avx2(auVar102,auVar65);
        auVar105._16_8_ = uVar128;
        auVar105._0_16_ = auVar127;
        auVar105._24_8_ = uVar129;
        auVar65 = vpminsw_avx2(auVar105,auVar73);
        auVar102 = vpminsw_avx2(auVar87,auVar63);
        auVar105 = vpminsw_avx2(auVar65,auVar102);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = *(ulong *)((long)in + lVar48 * 2);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)((long)in + lVar48 * 2 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar69,auVar126);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)((long)in + lVar48 * 2 + 0x240);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)((long)in + lVar48 * 2 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar79,auVar70);
        auVar143._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar143._16_16_ = ZEXT116(1) * auVar58;
        auVar104._16_8_ = uVar128;
        auVar104._0_16_ = auVar127;
        auVar104._24_8_ = uVar129;
        auVar114 = vpsubw_avx2(auVar143,auVar104);
        auVar65 = vpabsw_avx2(auVar114);
        auVar102 = vpsrlw_avx2(auVar65,ZEXT416(uVar54));
        auVar64 = vpsraw_avx2(auVar114,0xf);
        auVar102 = vpsubusw_avx2(auVar62,auVar102);
        auVar65 = vpminsw_avx2(auVar65,auVar102);
        auVar102 = vpaddw_avx2(auVar65,auVar64);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)((long)in + lVar53);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)((long)in + lVar53 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar80,auVar71);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)((long)in + lVar53 + 0x240);
        auVar98._8_8_ = 0;
        auVar98._0_8_ = *(ulong *)((long)in + lVar53 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar98,auVar81);
        auVar145._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar145._16_16_ = ZEXT116(1) * auVar58;
        auVar122._16_8_ = uVar128;
        auVar122._0_16_ = auVar127;
        auVar122._24_8_ = uVar129;
        auVar104 = vpsubw_avx2(auVar145,auVar122);
        auVar65 = vpabsw_avx2(auVar104);
        auVar114 = vpsrlw_avx2(auVar65,ZEXT416(uVar54));
        auVar104 = vpsraw_avx2(auVar104,0xf);
        auVar114 = vpsubusw_avx2(auVar62,auVar114);
        auVar65 = vpminsw_avx2(auVar65,auVar114);
        auVar65 = vpaddw_avx2(auVar65,auVar104);
        auVar102 = vpaddw_avx2(auVar65 ^ auVar104,auVar102 ^ auVar64);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)((long)in + lVar43 * 2);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)((long)in + lVar43 * 2 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar82,auVar72);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)((long)in + lVar43 * 2 + 0x240);
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)((long)in + lVar43 * 2 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar99,auVar83);
        auVar74._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar74._16_16_ = ZEXT116(1) * auVar58;
        auVar64._16_8_ = uVar128;
        auVar64._0_16_ = auVar127;
        auVar64._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar74,auVar64);
        auVar122 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar60 = ZEXT416(uVar54);
        auVar114 = vpsrlw_avx2(auVar65,auVar60);
        auVar114 = vpsubusw_avx2(auVar62,auVar114);
        auVar65 = vpminsw_avx2(auVar114,auVar65);
        auVar114 = vpaddw_avx2(auVar65,auVar122);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)((long)in + lVar50);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = *(ulong *)((long)in + lVar50 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar109,auVar84);
        auVar110._8_8_ = 0;
        auVar110._0_8_ = *(ulong *)((long)in + lVar50 + 0x240);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = *(ulong *)((long)in + lVar50 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar119,auVar110);
        auVar88._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar88._16_16_ = ZEXT116(1) * auVar58;
        auVar20._16_8_ = uVar128;
        auVar20._0_16_ = auVar127;
        auVar20._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar88,auVar20);
        auVar64 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar104 = vpsrlw_avx2(auVar65,auVar60);
        auVar104 = vpsubusw_avx2(auVar62,auVar104);
        auVar65 = vpminsw_avx2(auVar65,auVar104);
        auVar65 = vpaddw_avx2(auVar65,auVar64);
        auVar65 = vpaddw_avx2(auVar65 ^ auVar64,auVar114 ^ auVar122);
        auVar65 = vpaddw_avx2(auVar102,auVar65);
        auVar32._8_2_ = 2;
        auVar32._0_8_ = 0x2000200020002;
        auVar32._10_2_ = 2;
        auVar32._12_2_ = 2;
        auVar32._14_2_ = 2;
        auVar32._16_2_ = 2;
        auVar32._18_2_ = 2;
        auVar32._20_2_ = 2;
        auVar32._22_2_ = 2;
        auVar32._24_2_ = 2;
        auVar32._26_2_ = 2;
        auVar32._28_2_ = 2;
        auVar32._30_2_ = 2;
        auVar65 = vpmullw_avx2(auVar65,auVar32);
        auVar4 = vpaddw_avx2(auVar4,auVar65);
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)((long)in + lVar49 * 2);
        auVar92._8_8_ = 0;
        auVar92._0_8_ = *(ulong *)((long)in + lVar49 * 2 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar92,auVar61);
        auVar93._8_8_ = 0;
        auVar93._0_8_ = *(ulong *)((long)in + lVar49 * 2 + 0x240);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = *(ulong *)((long)in + lVar49 * 2 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar111,auVar93);
        auVar94._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar94._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
        auVar21._16_8_ = uVar128;
        auVar21._0_16_ = auVar127;
        auVar21._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar94,auVar21);
        auVar104 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar102 = vpsrlw_avx2(auVar65,auVar60);
        auVar102 = vpsubusw_avx2(auVar62,auVar102);
        auVar65 = vpminsw_avx2(auVar102,auVar65);
        auVar102 = vpaddw_avx2(auVar104,auVar65);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = *(ulong *)((long)in + lVar55);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = *(ulong *)((long)in + lVar55 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar120,auVar112);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = *(ulong *)((long)in + lVar55 + 0x240);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = *(ulong *)((long)in + lVar55 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar137,auVar121);
        auVar125._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar125._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
        auVar22._16_8_ = uVar128;
        auVar22._0_16_ = auVar127;
        auVar22._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar125,auVar22);
        auVar122 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar114 = vpsrlw_avx2(auVar65,auVar60);
        auVar114 = vpsubusw_avx2(auVar62,auVar114);
        auVar65 = vpminsw_avx2(auVar65,auVar114);
        auVar65 = vpaddw_avx2(auVar65,auVar122);
        auVar102 = vpaddw_avx2(auVar65 ^ auVar122,auVar104 ^ auVar102);
        auVar113._8_8_ = 0;
        auVar113._0_8_ = *(ulong *)((long)in + lVar52 * 2);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = *(ulong *)((long)in + lVar52 * 2 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar133,auVar113);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)((long)in + lVar52 * 2 + 0x240);
        auVar138._8_8_ = 0;
        auVar138._0_8_ = *(ulong *)((long)in + lVar52 * 2 + 0x360);
        auVar59 = vpunpcklqdq_avx(auVar138,auVar134);
        auVar116._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar116._16_16_ = ZEXT116(1) * auVar58;
        auVar23._16_8_ = uVar128;
        auVar23._0_16_ = auVar127;
        auVar23._24_8_ = uVar129;
        auVar65 = vpsubw_avx2(auVar116,auVar23);
        auVar64 = vpsraw_avx2(auVar65,0xf);
        auVar65 = vpabsw_avx2(auVar65);
        auVar114 = vpsrlw_avx2(auVar65,ZEXT416(uVar54));
        auVar114 = vpsubusw_avx2(auVar62,auVar114);
        auVar65 = vpminsw_avx2(auVar65,auVar114);
        auVar114 = vpaddw_avx2(auVar64,auVar65);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)((long)in + lVar40);
        auVar139._8_8_ = 0;
        auVar139._0_8_ = *(ulong *)((long)in + lVar40 + 0x120);
        auVar58 = vpunpcklqdq_avx(auVar139,auVar135);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)((long)in + lVar40 + 0x360);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)((long)in + lVar40 + 0x240);
        auVar59 = vpunpcklqdq_avx(auVar131,auVar140);
        auVar132._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar59;
        auVar132._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
        auVar24._16_8_ = uVar128;
        auVar24._0_16_ = auVar127;
        auVar24._24_8_ = uVar129;
        auVar122 = vpsubw_avx2(auVar132,auVar24);
        auVar65 = vpabsw_avx2(auVar122);
        auVar104 = vpsrlw_avx2(auVar65,ZEXT416(uVar54));
        auVar104 = vpsubusw_avx2(auVar62,auVar104);
        auVar65 = vpminsw_avx2(auVar65,auVar104);
        auVar104 = vpsraw_avx2(auVar122,0xf);
        auVar65 = vpaddw_avx2(auVar104,auVar65);
        auVar65 = vpaddw_avx2(auVar64 ^ auVar114,auVar104 ^ auVar65);
        auVar65 = vpaddw_avx2(auVar102,auVar65);
        auVar30._8_2_ = 1;
        auVar30._0_8_ = 0x1000100010001;
        auVar30._10_2_ = 1;
        auVar30._12_2_ = 1;
        auVar30._14_2_ = 1;
        auVar30._16_2_ = 1;
        auVar30._18_2_ = 1;
        auVar30._20_2_ = 1;
        auVar30._22_2_ = 1;
        auVar30._24_2_ = 1;
        auVar30._26_2_ = 1;
        auVar30._28_2_ = 1;
        auVar30._30_2_ = 1;
        auVar65 = vpmullw_avx2(auVar65,auVar30);
        auVar65 = vpaddw_avx2(auVar65,auVar4);
        auVar4 = vpmaxub_avx2(auVar143,auVar145);
        auVar102 = vpmaxub_avx2(auVar74,auVar88);
        auVar4 = vpmaxub_avx2(auVar4,auVar102);
        auVar102 = vpmaxub_avx2(auVar125,auVar94);
        auVar102 = vpmaxub_avx2(auVar116,auVar102);
        auVar114 = vpmaxub_avx2(auVar4,auVar102);
        auVar27._8_2_ = 0xbfff;
        auVar27._0_8_ = 0xbfffbfffbfffbfff;
        auVar27._10_2_ = 0xbfff;
        auVar27._12_2_ = 0xbfff;
        auVar27._14_2_ = 0xbfff;
        auVar27._16_2_ = 0xbfff;
        auVar27._18_2_ = 0xbfff;
        auVar27._20_2_ = 0xbfff;
        auVar27._22_2_ = 0xbfff;
        auVar27._24_2_ = 0xbfff;
        auVar27._26_2_ = 0xbfff;
        auVar27._28_2_ = 0xbfff;
        auVar27._30_2_ = 0xbfff;
        auVar4 = vpand_avx2(auVar27,auVar136);
        auVar136._16_8_ = uVar128;
        auVar136._0_16_ = auVar127;
        auVar136._24_8_ = uVar129;
        auVar102 = vpmaxsw_avx2(auVar136,auVar4);
        auVar4 = vpmaxub_avx2(auVar132,auVar114);
        auVar4 = vpand_avx2(auVar27,auVar4);
        auVar4 = vpmaxsw_avx2(auVar102,auVar4);
        auVar102 = vpminsw_avx2(auVar143,auVar124);
        auVar102 = vpminsw_avx2(auVar145,auVar102);
        auVar102 = vpminsw_avx2(auVar102,auVar105);
        auVar114 = vpminsw_avx2(auVar74,auVar88);
        auVar114 = vpminsw_avx2(auVar114,auVar94);
        auVar114 = vpminsw_avx2(auVar125,auVar114);
        auVar102 = vpminsw_avx2(auVar102,auVar114);
        auVar114 = vpminsw_avx2(auVar116,auVar132);
        auVar102 = vpminsw_avx2(auVar102,auVar114);
        auVar114 = vpsraw_avx2(auVar65,0xf);
        auVar39._8_2_ = 8;
        auVar39._0_8_ = 0x8000800080008;
        auVar39._10_2_ = 8;
        auVar39._12_2_ = 8;
        auVar39._14_2_ = 8;
        auVar39._16_2_ = 8;
        auVar39._18_2_ = 8;
        auVar39._20_2_ = 8;
        auVar39._22_2_ = 8;
        auVar39._24_2_ = 8;
        auVar39._26_2_ = 8;
        auVar39._28_2_ = 8;
        auVar39._30_2_ = 8;
        auVar65 = vpaddw_avx2(auVar65,auVar39);
        auVar65 = vpaddw_avx2(auVar65,auVar114);
        auVar65 = vpsraw_avx2(auVar65,4);
        auVar25._16_8_ = uVar128;
        auVar25._0_16_ = auVar127;
        auVar25._24_8_ = uVar129;
        auVar65 = vpaddw_avx2(auVar25,auVar65);
        auVar65 = vpmaxsw_avx2(auVar65,auVar102);
        auVar65 = vpminsw_avx2(auVar65,auVar4);
        auVar65 = vpackuswb_avx2(auVar65,auVar65);
        *(int *)dest = auVar65._20_4_;
        *(int *)((long)dest + lVar46) = auVar65._16_4_;
        *(int *)((long)dest + lVar46 * 2) = auVar65._4_4_;
        *(int *)((long)dest + lVar46 * 3) = auVar65._0_4_;
        uVar45 = uVar45 + 4;
        in = (uint16_t *)((long)in + 0x480);
        dest = (void *)((long)dest + lVar46 * 4);
      } while (uVar45 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_0)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}